

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest13 *this,uint n_id)

{
  ostream *poVar1;
  stringstream result_sstream;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(&local_188,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(vertices = 4) out;\nsubroutine void SubroutineTCType(inout vec4 result);\n\nsubroutine(SubroutineTCType) void SubroutineTC1(inout vec4 result)\n{\n    result += vec4(0, "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) * 0.25);
  poVar1 = std::operator<<(poVar1,
                           ", 0, 0);\n}\nsubroutine(SubroutineTCType) void SubroutineTC2(inout vec4 result)\n{\n    result += vec4(0, "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(n_id + 1) * 0.025);
  std::operator<<(poVar1,
                  ", 0, 0);\n}\n\nsubroutine uniform SubroutineTCType function;\n\nin VS_DATA\n{\n    vec4 data;\n} in_vs[];\n\nout TC_DATA\n{\n    vec4 data;\n} out_tc[];\n\nin gl_PerVertex { vec4 gl_Position; } gl_in[];\nout gl_PerVertex { vec4 gl_Position; } gl_out[];\nvoid main()\n{\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n    gl_TessLevelOuter[2]                = 1.0;\n    gl_TessLevelOuter[3]                = 1.0;\n    gl_TessLevelInner[0]                = 1.0;\n    gl_TessLevelInner[1]                = 1.0;\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    out_tc[gl_InvocationID].data        = in_vs[0].data;\n\n    function(out_tc[gl_InvocationID].data);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest13::getTessellationControlShaderBody(unsigned int n_id)
{
	std::stringstream result_sstream;

	/* Pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "layout(vertices = 4) out;\n"
					  /* Sub-routine */
					  "subroutine void SubroutineTCType(inout vec4 result);\n"
					  "\n"
					  "subroutine(SubroutineTCType) void SubroutineTC1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4(0, "
				   << float(n_id + 1) * 0.25f << ", 0, 0);\n"
												 "}\n"
												 "subroutine(SubroutineTCType) void SubroutineTC2(inout vec4 result)\n"
												 "{\n"
												 "    result += vec4(0, "
				   << float(n_id + 1) * 0.025f
				   << ", 0, 0);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform SubroutineTCType function;\n"
					  "\n"
					  /* Input block */
					  "in VS_DATA\n"
					  "{\n"
					  "    vec4 data;\n"
					  "} in_vs[];\n"
					  "\n"
					  /* Output block */
					  "out TC_DATA\n"
					  "{\n"
					  "    vec4 data;\n"
					  "} out_tc[];\n"
					  "\n"
					  "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n"
					  "out gl_PerVertex { vec4 gl_Position; } gl_out[];\n"
					  /* main() declaration */
					  "void main()\n"
					  "{\n"
					  "    gl_TessLevelOuter[0]                = 1.0;\n"
					  "    gl_TessLevelOuter[1]                = 1.0;\n"
					  "    gl_TessLevelOuter[2]                = 1.0;\n"
					  "    gl_TessLevelOuter[3]                = 1.0;\n"
					  "    gl_TessLevelInner[0]                = 1.0;\n"
					  "    gl_TessLevelInner[1]                = 1.0;\n"
					  "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
					  "    out_tc[gl_InvocationID].data        = in_vs[0].data;\n"
					  "\n"
					  "    function(out_tc[gl_InvocationID].data);\n"
					  "}\n";

	return result_sstream.str();
}